

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O3

void save_load_sampling(boosting *o,io_buf *model_file,bool read,bool text)

{
  shared_data *psVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  float f;
  stringstream os;
  undefined4 local_340 [4];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"boosts ",7);
    plVar2 = (long *)std::ostream::operator<<((ostream *)local_1a8,o->N);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)o,4,"");
      std::vector<float,_std::allocator<float>_>::resize(&o->alpha,(long)o->N);
      std::vector<float,_std::allocator<float>_>::resize(&o->v,(long)o->N);
    }
    else {
      bin_text_write_fixed(model_file,(char *)o,4,(stringstream *)local_1b8,text);
    }
    if (0 < o->N) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)local_340,4,"");
          *(undefined4 *)
           ((long)(o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar4) = local_340[0];
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"alpha ",6);
          poVar5 = std::ostream::_M_insert<double>
                             ((double)*(float *)((long)(o->alpha).
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar4))
          ;
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          bin_text_write_fixed
                    (model_file,
                     (char *)((long)(o->alpha).super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar4),4,
                     (stringstream *)local_340,text);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
          std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 4;
      } while (lVar3 < o->N);
      if (0 < o->N) {
        lVar4 = 0;
        lVar3 = 0;
        do {
          if (read) {
            io_buf::bin_read_fixed(model_file,(char *)local_340,4,"");
            *(undefined4 *)
             ((long)(o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar4) = local_340[0];
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_340);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"v ",2);
            poVar5 = std::ostream::_M_insert<double>
                               ((double)*(float *)((long)(o->v).
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar4))
            ;
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            bin_text_write_fixed
                      (model_file,
                       (char *)((long)(o->v).super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar4),4,
                       (stringstream *)local_340,text);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
            std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
          }
          lVar3 = lVar3 + 1;
          lVar4 = lVar4 + 4;
        } while (lVar3 < o->N);
      }
    }
    if (read) {
      poVar5 = (ostream *)&std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Loading alpha and v: ",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Saving alpha and v, current weighted_examples = ",0x30);
      psVar1 = o->all->sd;
      poVar5 = std::ostream::_M_insert<double>
                         (psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    }
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (0 < o->N) {
      lVar3 = 0;
      do {
        poVar5 = std::ostream::_M_insert<double>
                           ((double)(o->alpha).super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>
                           ((double)(o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl
                                    .super__Vector_impl_data._M_start[lVar3]);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        lVar3 = lVar3 + 1;
      } while (lVar3 < o->N);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void save_load_sampling(boosting& o, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() == 0)
    return;
  stringstream os;
  os << "boosts " << o.N << endl;
  bin_text_read_write_fixed(model_file, (char*)&(o.N), sizeof(o.N), "", read, os, text);

  if (read)
  {
    o.alpha.resize(o.N);
    o.v.resize(o.N);
  }

  for (int i = 0; i < o.N; i++)
    if (read)
    {
      float f;
      model_file.bin_read_fixed((char*)&f, sizeof(f), "");
      o.alpha[i] = f;
    }
    else
    {
      stringstream os2;
      os2 << "alpha " << o.alpha[i] << endl;
      bin_text_write_fixed(model_file, (char*)&(o.alpha[i]), sizeof(o.alpha[i]), os2, text);
    }

  for (int i = 0; i < o.N; i++)
    if (read)
    {
      float f;
      model_file.bin_read_fixed((char*)&f, sizeof(f), "");
      o.v[i] = f;
    }
    else
    {
      stringstream os2;
      os2 << "v " << o.v[i] << endl;
      bin_text_write_fixed(model_file, (char*)&(o.v[i]), sizeof(o.v[i]), os2, text);
    }

  if (read)
  {
    cerr << "Loading alpha and v: " << endl;
  }
  else
  {
    cerr << "Saving alpha and v, current weighted_examples = "
         << o.all->sd->weighted_labeled_examples + o.all->sd->weighted_unlabeled_examples << endl;
  }
  for (int i = 0; i < o.N; i++)
  {
    cerr << o.alpha[i] << " " << o.v[i] << endl;
  }
  cerr << endl;
}